

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O2

int tc_uECC_valid_public_key(uint8_t *public_key,tc_uECC_Curve curve)

{
  char cVar1;
  cmpresult_t cVar2;
  int iVar3;
  uint local_68 [2];
  tc_uECC_word_t _public [16];
  
  cVar1 = curve->num_bytes;
  tc_uECC_vli_bytesToNative(local_68,public_key,(int)cVar1);
  tc_uECC_vli_bytesToNative(_public + (long)curve->num_words + -2,public_key + cVar1,(int)cVar1);
  cVar2 = tc_uECC_vli_cmp_unsafe(local_68,curve->G,'\x10');
  if (cVar2 == '\0') {
    iVar3 = -4;
  }
  else {
    iVar3 = tc_uECC_valid_point(local_68,curve);
  }
  return iVar3;
}

Assistant:

int tc_uECC_valid_public_key(const uint8_t *public_key, tc_uECC_Curve curve)
{

	tc_uECC_word_t _public[NUM_ECC_WORDS * 2];

	tc_uECC_vli_bytesToNative(_public, public_key, curve->num_bytes);
	tc_uECC_vli_bytesToNative(
	_public + curve->num_words,
	public_key + curve->num_bytes,
	curve->num_bytes);

	if (tc_uECC_vli_cmp_unsafe(_public, curve->G, NUM_ECC_WORDS * 2) == 0) {
		return -4;
	}

	return tc_uECC_valid_point(_public, curve);
}